

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_command(void)

{
  allocator local_b1;
  string local_b0 [32];
  shared_ptr<command::LightCommand> local_90;
  shared_ptr<command::ICommand> local_80;
  shared_ptr<command::FanCommand> local_70;
  shared_ptr<command::ICommand> local_60;
  undefined1 local_50 [8];
  Button button;
  allocator local_29;
  string local_28 [32];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"command",&local_29);
  print_func_begin((string *)local_28);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  command::Button::Button((Button *)local_50);
  std::make_shared<command::FanCommand>();
  std::shared_ptr<command::ICommand>::shared_ptr<command::FanCommand,void>(&local_60,&local_70);
  command::Button::SetCommand((Button *)local_50,&local_60);
  std::shared_ptr<command::ICommand>::~shared_ptr(&local_60);
  std::shared_ptr<command::FanCommand>::~shared_ptr(&local_70);
  command::Button::PressButton((Button *)local_50);
  std::make_shared<command::LightCommand>();
  std::shared_ptr<command::ICommand>::shared_ptr<command::LightCommand,void>(&local_80,&local_90);
  command::Button::SetCommand((Button *)local_50,&local_80);
  std::shared_ptr<command::ICommand>::~shared_ptr(&local_80);
  std::shared_ptr<command::LightCommand>::~shared_ptr(&local_90);
  command::Button::PressButton((Button *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"command",&local_b1);
  print_func_end((string *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  command::Button::~Button((Button *)local_50);
  return;
}

Assistant:

void test_command() {
    print_func_begin("command");
    command::Button button;
    button.SetCommand(std::make_shared<command::FanCommand>());
    button.PressButton();
    button.SetCommand(std::make_shared<command::LightCommand>());
    button.PressButton();
    print_func_end("command");
}